

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::Read
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,TPZStream *buf,void *context)

{
  TPZSavable *pTVar1;
  TPZStepSolver<float> *pTVar2;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZAutoPointer<TPZDohrAssembly<float>_>::operator=
            (&this->fAssemble,(TPZAutoPointer<TPZDohrAssembly<float>_> *)((long)context + 0x40));
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  ::operator=(&this->fGlobal,
              (list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
               *)((long)context + 0x20));
  (*buf->_vptr_TPZStream[0x1f])(buf,&this->fNumCoarse,1);
  (*buf->_vptr_TPZStream[0x1d])(buf,&this->fNumThreads,1);
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar2 = (TPZStepSolver<float> *)0x0;
  }
  else {
    pTVar2 = (TPZStepSolver<float> *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZStepSolver<float>::typeinfo,0);
  }
  this->fCoarse = pTVar2;
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf,context);
    TPZDohrMatrix<TVar,TSubStruct> *ptr = (TPZDohrMatrix<TVar,TSubStruct> *)(context);
    fAssemble = ptr->fAssembly;
    fGlobal = ptr->SubStructures();
    buf.Read(&fNumCoarse);
    buf.Read(&fNumThreads);
    fCoarse = dynamic_cast<TPZStepSolver<TVar> *>(TPZPersistenceManager::GetInstance(&buf));
}